

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

String * __thiscall asl::String::operator=(String *this,wchar_t **x)

{
  undefined1 local_30 [8];
  String s;
  wchar_t **x_local;
  String *this_local;
  
  s.field_2._8_8_ = x;
  String((String *)local_30,*x);
  operator=(this,(String *)local_30);
  ~String((String *)local_30);
  return this;
}

Assistant:

String& operator=(const T& x) { String s=x; *this = s; return *this; }